

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

string * __thiscall pbrt::Bounds2<int>::ToString_abi_cxx11_(Bounds2<int> *this)

{
  string *in_RDI;
  Point2<int> *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::Point2<int>const&,pbrt::Point2<int>const&>
            (in_stack_00000018,in_stack_00000010,&this->pMin);
  return in_RDI;
}

Assistant:

std::string ToString() const { return StringPrintf("[ %s - %s ]", pMin, pMax); }